

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_byte_string(json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *this,byte_string_view *b,semantic_tag tag,ser_context *param_3,
                   error_code *param_4)

{
  structure_type sVar1;
  semantic_tag local_21;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_20;
  
  sVar1 = (this->structure_stack_).
          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type_;
  local_21 = tag;
  if (sVar1 - array_t < 2) {
    local_20._0_8_ = this->index_;
    this->index_ = local_20._0_8_ + 1;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::string,unsigned_long,jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,jsoncons::semantic_tag&>
              ((vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)&this->item_stack_,&this->name_,(unsigned_long *)&local_20,
               (byte_string_arg_t *)&byte_string_arg,b,&local_21);
  }
  else if (sVar1 == root_t) {
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
    basic_json<jsoncons::byte_string_view>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &local_20,b,tag,&this->field_0x8,0);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator=
              (&this->result_,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &local_20.common_);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &local_20.common_);
    this->is_valid_ = true;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                           semantic_tag tag, 
                           const ser_context&,
                           std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, byte_string_arg, b, tag);
                break;
            case structure_type::root_t:
                result_ = Json(byte_string_arg, b, tag, allocator_);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }